

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

Ptr __thiscall SimpleSyntaxAnalyzer::analyze(SimpleSyntaxAnalyzer *this,TokenReader *tokens)

{
  __shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *__r;
  SimpleASTNode *this_00;
  char cVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar2;
  undefined1 local_b0 [8];
  Token token;
  undefined1 auStack_68 [8];
  Ptr child;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  TokenReader::peek();
  if (local_b0._0_4_ != NONE_TYPE) {
    if (local_b0._0_4_ == KEY_TYPE) {
      TokenReader::read();
      Token::operator=((Token *)local_b0,(Token *)auStack_68);
      std::__cxx11::string::~string((string *)&child);
      token.val.field_2._8_4_ = 0;
      std::make_shared<SimpleASTNode,ASTNodeType_const&,std::__cxx11::string_const&>
                ((ASTNodeType *)auStack_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&token.val.field_2 + 8));
      std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)auStack_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child);
      __r = (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
            ((long)&token.val.field_2 + 8);
      while( true ) {
        cVar1 = TokenReader::end();
        if (cVar1 != '\0') break;
        auStack_68 = (undefined1  [8])0x0;
        child.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        express((TokenReader *)__r);
        std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,__r);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff80);
        this_00 = *(SimpleASTNode **)this;
        std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)
                   &stack0xffffffffffffff88,
                   (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)auStack_68);
        SimpleASTNode::addChild(this_00,(Ptr *)&stack0xffffffffffffff88);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child);
      }
    }
    else {
      express((TokenReader *)auStack_68);
      std::__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2> *)auStack_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&child);
    }
  }
  std::__cxx11::string::~string((string *)&token);
  PVar2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SimpleASTNode::Ptr SimpleSyntaxAnalyzer::analyze(TokenReader& tokens)
{
    SimpleASTNode::Ptr node = nullptr;
    Token token = tokens.peek();
    if (!token.isEmpty()) {
        if (token.type == TokenType::KEY_TYPE) {
            token = tokens.read();
            node = SimpleASTNode::create(ASTNodeType::DECLARATION, token.val);
            while (!tokens.end()) {
                SimpleASTNode::Ptr child;
                child = express(tokens);
                node->addChild(child);
            }
        } else {
            node = express(tokens);
        }
    }
    return node;
}